

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::javanano::FileClassName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FileDescriptor *file)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  string sStack_58;
  string basename;
  
  bVar1 = Params::has_java_outer_classname
                    ((Params *)this,(string *)(params->empty_)._M_dataplus._M_p);
  if (bVar1) {
    psVar2 = Params::java_outer_classname
                       ((Params *)this,(string *)(params->empty_)._M_dataplus._M_p);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    basename._M_dataplus._M_p = (pointer)&basename.field_2;
    basename._M_string_length = 0;
    basename.field_2._M_local_buf[0] = '\0';
    lVar3 = std::__cxx11::string::rfind((char)(params->empty_)._M_dataplus._M_p,0x2f);
    if (lVar3 == -1) {
      std::__cxx11::string::_M_assign((string *)&basename);
    }
    else {
      std::__cxx11::string::substr((ulong)&sStack_58,(ulong)(params->empty_)._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&basename,(string *)&sStack_58);
      std::__cxx11::string::~string((string *)&sStack_58);
    }
    StripProto(&sStack_58,&basename);
    anon_unknown_1::UnderscoresToCamelCaseImpl(__return_storage_ptr__,&sStack_58,true);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&basename);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileClassName(const Params& params, const FileDescriptor* file) {
  if (params.has_java_outer_classname(file->name())) {
    return params.java_outer_classname(file->name());
  } else {
    // Use the filename itself with underscores removed
    // and a CamelCase style name.
    string basename;
    string::size_type last_slash = file->name().find_last_of('/');
    if (last_slash == string::npos) {
      basename = file->name();
    } else {
      basename = file->name().substr(last_slash + 1);
    }
    return UnderscoresToCamelCaseImpl(StripProto(basename), true);
  }
}